

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSettingsInstallHandler(ImGuiContext *context)

{
  ImGuiID IVar1;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  char *v;
  undefined4 in_stack_ffffffffffffffb4;
  
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)0x1b2e8b);
  v = "Table";
  IVar1 = ImHashStr("Table",0,0);
  ImVector<ImGuiSettingsHandler>::push_back
            ((ImVector<ImGuiSettingsHandler> *)CONCAT44(in_stack_ffffffffffffffb4,IVar1),
             (ImGuiSettingsHandler *)v);
  return;
}

Assistant:

void ImGui::TableSettingsInstallHandler(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Table";
    ini_handler.TypeHash = ImHashStr("Table");
    ini_handler.ClearAllFn = TableSettingsHandler_ClearAll;
    ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = TableSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}